

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

void Dar_LibDumpPriorities(void)

{
  int iVar1;
  Dar_Lib_t *pDVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  printf("\nOutput priorities (total = %d):\n",(ulong)(uint)s_DarLib->nSubgrTotal);
  lVar6 = 0;
  iVar4 = 0;
  iVar7 = 0;
  pDVar2 = s_DarLib;
  do {
    if (0 < pDVar2->nSubgr[lVar6]) {
      lVar5 = 0;
      do {
        iVar1 = pDVar2->pPrios[lVar6][lVar5];
        iVar3 = iVar1;
        if (lVar5 != 0) {
          iVar3 = pDVar2->pPrios[lVar6][lVar5 + -1];
        }
        if (pDVar2->pScore[lVar6][iVar3] < pDVar2->pScore[lVar6][iVar1]) {
          __assert_fail("s_DarLib->pScore[i][Out2] >= s_DarLib->pScore[i][Out]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                        ,0x2a7,"void Dar_LibDumpPriorities()");
        }
        printf("%d, ");
        iVar7 = iVar7 + 1;
        if (iVar7 == 0xf) {
          putchar(10);
          iVar7 = 0;
        }
        lVar5 = lVar5 + 1;
        pDVar2 = s_DarLib;
      } while (lVar5 < s_DarLib->nSubgr[lVar6]);
      iVar4 = iVar4 + (int)lVar5;
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0xde) {
      putchar(10);
      if (iVar4 == s_DarLib->nSubgrTotal) {
        return;
      }
      __assert_fail("Printed == s_DarLib->nSubgrTotal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                    ,0x2b3,"void Dar_LibDumpPriorities()");
    }
  } while( true );
}

Assistant:

void Dar_LibDumpPriorities()
{
    int i, k, Out, Out2, Counter = 0, Printed = 0;
    printf( "\nOutput priorities (total = %d):\n", s_DarLib->nSubgrTotal );
    for ( i = 0; i < 222; i++ )
    {
//        printf( "Class%d: ", i );
        for ( k = 0; k < s_DarLib->nSubgr[i]; k++ )
        {
            Out = s_DarLib->pPrios[i][k];
            Out2 = k == 0 ? Out : s_DarLib->pPrios[i][k-1];
            assert( s_DarLib->pScore[i][Out2] >= s_DarLib->pScore[i][Out] );
//            printf( "%d(%d), ", Out, s_DarLib->pScore[i][Out] );
            printf( "%d, ", Out );
            Printed++;
            if ( ++Counter == 15 )
            {
                printf( "\n" );
                Counter = 0;
            }
        }
    }
    printf( "\n" );
    assert( Printed == s_DarLib->nSubgrTotal );
}